

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-util.cc
# Opt level: O2

Arities __thiscall wabt::ModuleContext::GetExprArity(ModuleContext *this,Expr *expr)

{
  FILE *pFVar1;
  Index IVar2;
  IfExpr *pIVar3;
  VarExpr<(wabt::ExprType)9> *pVVar4;
  CallIndirectExpr *pCVar5;
  TryExpr *pTVar6;
  VarExpr<(wabt::ExprType)12> *pVVar7;
  VarExpr<(wabt::ExprType)8> *pVVar8;
  SimdLaneOpExpr *pSVar9;
  ReturnCallIndirectExpr *pRVar10;
  BrTableExpr *pBVar11;
  VarExpr<(wabt::ExprType)38> *pVVar12;
  VarExpr<(wabt::ExprType)54> *pVVar13;
  Event *pEVar14;
  char *pcVar15;
  uint uVar16;
  undefined4 uVar17;
  undefined8 in_RDX;
  undefined7 uVar18;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ulong uVar19;
  Arities AVar20;
  ulong uStack_30;
  
  pFVar1 = _stderr;
  uStack_30 = 2;
  uVar19 = 1;
  uVar18 = (undefined7)((ulong)in_RDX >> 8);
  switch(expr->type_) {
  case AtomicLoad:
  case BrOnExn:
  case Convert:
  case Load:
  case LocalTee:
  case MemoryGrow:
  case RefIsNull:
  case TableGet:
  case Unary:
    uVar19 = 1;
    uVar17 = 0;
    uStack_30 = 1;
    goto LAB_00174245;
  case AtomicRmw:
  case AtomicNotify:
  case Binary:
  case Compare:
  case SimdShuffleOp:
  case TableGrow:
    break;
  case AtomicRmwCmpxchg:
  case AtomicWait:
  case Select:
  case Ternary:
    uStack_30 = 3;
    break;
  case AtomicStore:
  case Store:
  case TableSet:
    goto switchD_00174124_caseD_3;
  case Block:
    pTVar6 = (TryExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(expr);
    goto LAB_0017422e;
  case Br:
    pVVar8 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(expr);
    IVar2 = GetLabelArity(this,&pVVar8->var);
    uStack_30 = (ulong)IVar2;
    in_RDX = extraout_RDX;
    goto LAB_00174328;
  case BrIf:
    pVVar4 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(expr);
    IVar2 = GetLabelArity(this,&pVVar4->var);
    uVar19 = (ulong)IVar2;
    uStack_30 = (ulong)(IVar2 + 1);
    break;
  case BrTable:
    pBVar11 = cast<wabt::BrTableExpr,wabt::Expr>(expr);
    IVar2 = GetLabelArity(this,&pBVar11->default_target);
    uStack_30 = (ulong)(IVar2 + 1);
    in_RDX = extraout_RDX_01;
    goto LAB_00174328;
  case Call:
    pVVar7 = cast<wabt::VarExpr<(wabt::ExprType)12>,wabt::Expr>(expr);
    IVar2 = GetFuncParamCount(this,&pVVar7->var);
    uStack_30 = (ulong)IVar2;
    IVar2 = GetFuncResultCount(this,&pVVar7->var);
    uVar19 = (ulong)IVar2;
    break;
  case CallIndirect:
    pCVar5 = cast<wabt::CallIndirectExpr,wabt::Expr>(expr);
    uStack_30 = (ulong)((int)((ulong)((long)(pCVar5->decl).sig.param_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pCVar5->decl).sig.param_types.
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) + 1);
    uVar19 = (ulong)((long)(pCVar5->decl).sig.result_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pCVar5->decl).sig.result_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    break;
  case Const:
  case GlobalGet:
  case LocalGet:
  case MemorySize:
  case RefFunc:
  case RefNull:
  case TableSize:
    goto switchD_00174124_caseD_f;
  case Drop:
  case GlobalSet:
  case LocalSet:
    uStack_30 = 1;
    goto switchD_00174124_caseD_3;
  case If:
    pIVar3 = cast<wabt::IfExpr,wabt::Expr>(expr);
    uVar19 = (ulong)((long)*(pointer *)
                            ((long)&(pIVar3->true_).decl.sig.result_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data + 8) -
                    (long)(pIVar3->true_).decl.sig.result_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uStack_30 = 1;
    break;
  case Loop:
    pTVar6 = (TryExpr *)cast<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Expr>(expr);
    goto LAB_0017422e;
  case MemoryCopy:
  case MemoryFill:
  case MemoryInit:
  case TableCopy:
  case TableInit:
    uStack_30 = 3;
switchD_00174124_caseD_3:
    uVar19 = 0;
    break;
  case DataDrop:
  case Nop:
  case ElemDrop:
    uVar19 = 0;
    goto switchD_00174124_caseD_f;
  case Rethrow:
    uVar17 = (undefined4)CONCAT71(uVar18,1);
    uVar19 = 0;
    goto LAB_0017435d;
  case Return:
    uStack_30 = (ulong)((long)(this->current_func_->decl).sig.result_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->current_func_->decl).sig.result_types.
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2;
    goto LAB_00174328;
  case ReturnCall:
    pVVar12 = cast<wabt::VarExpr<(wabt::ExprType)38>,wabt::Expr>(expr);
    IVar2 = GetFuncParamCount(this,&pVVar12->var);
    uStack_30 = (ulong)IVar2;
    IVar2 = GetFuncResultCount(this,&pVVar12->var);
    uVar19 = (ulong)IVar2;
    in_RDX = extraout_RDX_02;
    goto LAB_00174328;
  case ReturnCallIndirect:
    pRVar10 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(expr);
    uStack_30 = (ulong)((int)((ulong)((long)(pRVar10->decl).sig.param_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pRVar10->decl).sig.param_types.
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) + 1);
    uVar19 = (ulong)((long)(pRVar10->decl).sig.result_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pRVar10->decl).sig.result_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    in_RDX = extraout_RDX_00;
LAB_00174328:
    uVar17 = (undefined4)CONCAT71((int7)((ulong)in_RDX >> 8),1);
    goto LAB_00174245;
  case SimdLaneOp:
    pSVar9 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(expr);
    pFVar1 = _stderr;
    uVar16 = (pSVar9->opcode).enum_ - I8X16ExtractLaneS;
    if ((0x12 < uVar16) || ((0x6db77U >> (uVar16 & 0x1f) & 1) == 0)) {
      pcVar15 = GetExprTypeName(expr);
      fprintf(pFVar1,"Invalid Opcode for expr type: %s\n",pcVar15);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir-util.cc"
                    ,0xfc,
                    "ModuleContext::Arities wabt::ModuleContext::GetExprArity(const Expr &) const");
    }
    uStack_30 = (ulong)*(uint *)(&DAT_0018a860 + (ulong)uVar16 * 4);
    break;
  default:
    pcVar15 = GetExprTypeName(expr);
    fprintf(pFVar1,"bad expr type: %s\n",pcVar15);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/ir-util.cc"
                  ,0x106,
                  "ModuleContext::Arities wabt::ModuleContext::GetExprArity(const Expr &) const");
  case Throw:
    pVVar13 = cast<wabt::VarExpr<(wabt::ExprType)54>,wabt::Expr>(expr);
    pEVar14 = Module::GetEvent(this->module,&pVVar13->var);
    uVar17 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX_03 >> 8),1);
    uVar19 = 0;
    if (pEVar14 != (Event *)0x0) {
      uStack_30 = (ulong)((long)(pEVar14->decl).sig.param_types.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pEVar14->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2;
      goto LAB_00174245;
    }
    goto LAB_0017435d;
  case Try:
    pTVar6 = cast<wabt::TryExpr,wabt::Expr>(expr);
LAB_0017422e:
    uVar19 = (ulong)((long)*(pointer *)
                            ((long)&(pTVar6->block).decl.sig.result_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data + 8) -
                    (long)(pTVar6->block).decl.sig.result_types.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
switchD_00174124_caseD_f:
    uStack_30 = 0;
    break;
  case Last:
    uVar17 = (undefined4)CONCAT71(uVar18,1);
LAB_0017435d:
    uStack_30 = 0;
    goto LAB_00174245;
  }
  uVar17 = 0;
LAB_00174245:
  AVar20._0_8_ = uStack_30 & 0xffffffff | uVar19 << 0x20;
  AVar20._8_4_ = uVar17;
  return AVar20;
}

Assistant:

ModuleContext::Arities ModuleContext::GetExprArity(const Expr& expr) const {
  switch (expr.type()) {
    case ExprType::AtomicNotify:
    case ExprType::AtomicRmw:
    case ExprType::Binary:
    case ExprType::Compare:
    case ExprType::TableGrow:
      return { 2, 1 };

    case ExprType::AtomicStore:
    case ExprType::Store:
    case ExprType::TableSet:
      return { 2, 0 };

    case ExprType::Block:
      return { 0, cast<BlockExpr>(&expr)->block.decl.sig.GetNumResults() };

    case ExprType::Br:
      return { GetLabelArity(cast<BrExpr>(&expr)->var), 1, true };

    case ExprType::BrIf: {
      Index arity = GetLabelArity(cast<BrIfExpr>(&expr)->var);
      return { arity + 1, arity };
    }

    case ExprType::BrOnExn:
      return { 1, 1 };

    case ExprType::BrTable:
      return { GetLabelArity(cast<BrTableExpr>(&expr)->default_target) + 1, 1,
               true };

    case ExprType::Call: {
      const Var& var = cast<CallExpr>(&expr)->var;
      return { GetFuncParamCount(var), GetFuncResultCount(var) };
    }

    case ExprType::ReturnCall: {
      const Var& var = cast<ReturnCallExpr>(&expr)->var;
      return { GetFuncParamCount(var), GetFuncResultCount(var), true };
    }

    case ExprType::CallIndirect: {
      const auto* ci_expr = cast<CallIndirectExpr>(&expr);
      return { ci_expr->decl.GetNumParams() + 1,
               ci_expr->decl.GetNumResults() };
    }

    case ExprType::ReturnCallIndirect: {
      const auto* rci_expr = cast<ReturnCallIndirectExpr>(&expr);
      return { rci_expr->decl.GetNumParams() + 1,
               rci_expr->decl.GetNumResults(), true };
    }

    case ExprType::Const:
    case ExprType::GlobalGet:
    case ExprType::LocalGet:
    case ExprType::MemorySize:
    case ExprType::TableSize:
    case ExprType::RefNull:
    case ExprType::RefFunc:
      return { 0, 1 };

    case ExprType::Unreachable:
      return { 0, 1, true };

    case ExprType::DataDrop:
    case ExprType::ElemDrop:
      return { 0, 0 };

    case ExprType::MemoryInit:
    case ExprType::TableInit:
    case ExprType::MemoryFill:
    case ExprType::MemoryCopy:
    case ExprType::TableCopy:
      return { 3, 0 };

    case ExprType::AtomicLoad:
    case ExprType::Convert:
    case ExprType::Load:
    case ExprType::LocalTee:
    case ExprType::MemoryGrow:
    case ExprType::Unary:
    case ExprType::TableGet:
    case ExprType::RefIsNull:
      return { 1, 1 };

    case ExprType::Drop:
    case ExprType::GlobalSet:
    case ExprType::LocalSet:
      return { 1, 0 };

    case ExprType::If:
      return { 1, cast<IfExpr>(&expr)->true_.decl.sig.GetNumResults() };

    case ExprType::Loop:
      return { 0, cast<LoopExpr>(&expr)->block.decl.sig.GetNumResults() };

    case ExprType::Nop:
      return { 0, 0 };

    case ExprType::Return:
      return
        { static_cast<Index>(current_func_->decl.sig.result_types.size()), 1,
          true };

    case ExprType::Rethrow:
      return { 0, 0, true };

    case ExprType::AtomicRmwCmpxchg:
    case ExprType::AtomicWait:
    case ExprType::Select:
      return { 3, 1 };

    case ExprType::Throw: {
      auto throw_ = cast<ThrowExpr>(&expr);
      Index operand_count = 0;
      if (Event* event = module.GetEvent(throw_->var)) {
        operand_count = event->decl.sig.param_types.size();
      }
      return { operand_count, 0, true };
    }

    case ExprType::Try:
      return { 0, cast<TryExpr>(&expr)->block.decl.sig.GetNumResults() };
      break;

    case ExprType::Ternary:
      return { 3, 1 };

    case ExprType::SimdLaneOp: {
      const Opcode opcode = cast<SimdLaneOpExpr>(&expr)->opcode;
      switch (opcode) {
        case Opcode::I8X16ExtractLaneS:
        case Opcode::I8X16ExtractLaneU:
        case Opcode::I16X8ExtractLaneS:
        case Opcode::I16X8ExtractLaneU:
        case Opcode::I32X4ExtractLane:
        case Opcode::I64X2ExtractLane:
        case Opcode::F32X4ExtractLane:
        case Opcode::F64X2ExtractLane:
          return { 1, 1 };

        case Opcode::I8X16ReplaceLane:
        case Opcode::I16X8ReplaceLane:
        case Opcode::I32X4ReplaceLane:
        case Opcode::I64X2ReplaceLane:
        case Opcode::F32X4ReplaceLane:
        case Opcode::F64X2ReplaceLane:
          return { 2, 1 };

        default:
          fprintf(stderr, "Invalid Opcode for expr type: %s\n",
                  GetExprTypeName(expr));
          assert(0);
          return { 0, 0 };
      }
    }

    case ExprType::SimdShuffleOp:
      return { 2, 1 };

    default:
      fprintf(stderr, "bad expr type: %s\n", GetExprTypeName(expr));
      assert(0);
      return { 0, 0 };
  }
}